

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O3

int ref_nonsingle(saucy *s,coloring *c,int *adj,int *edg,int cf)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  long lVar8;
  ulong uVar9;
  int *piVar10;
  
  lVar8 = (long)cf;
  iVar6 = c->clen[lVar8];
  if (iVar6 == 0) {
    iVar6 = ref_singleton(s,c,adj,edg,cf);
    return iVar6;
  }
  memcpy(s->junk,c->lab + lVar8,(long)(int)(iVar6 + 1U) << 2);
  if (-1 < iVar6) {
    uVar9 = 0;
    do {
      lVar4 = (long)s->junk[uVar9];
      iVar5 = adj[lVar4];
      if (iVar5 != adj[lVar4 + 1]) {
        piVar10 = edg + iVar5;
        do {
          iVar3 = *piVar10;
          if ((c->clen[c->cfront[iVar3]] != 0) &&
             (iVar1 = s->ccount[iVar3], s->ccount[iVar3] = iVar1 + 1, iVar1 == 0)) {
            move_to_back(s,c,iVar3);
          }
          piVar10 = piVar10 + 1;
          iVar5 = iVar5 + 1;
        } while (iVar5 != adj[lVar4 + 1]);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != iVar6 + 1U);
    iVar5 = refine_cell(s,c,ref_nonsingle_cell);
    if (-1 < iVar6) {
      piVar10 = c->lab;
      iVar3 = cf + iVar6;
      if (cf + iVar6 < cf) {
        iVar3 = cf;
      }
      do {
        lVar4 = (long)piVar10[lVar8];
        iVar6 = adj[lVar4];
        if (iVar6 != adj[lVar4 + 1]) {
          piVar2 = s->ccount;
          piVar7 = edg + iVar6;
          do {
            piVar2[*piVar7] = 0;
            piVar7 = piVar7 + 1;
            iVar6 = iVar6 + 1;
          } while (iVar6 != adj[lVar4 + 1]);
        }
        lVar8 = lVar8 + 1;
      } while (iVar3 + 1 != (int)lVar8);
    }
    return iVar5;
  }
  iVar6 = refine_cell(s,c,ref_nonsingle_cell);
  return iVar6;
}

Assistant:

static int
ref_nonsingle(struct saucy *s, struct coloring *c,
    const int *adj, const int *edg, int cf)
{
    int i, j, k, ret;
    const int cb = cf + c->clen[cf];
    const int size = cb - cf + 1;

    /* Double check for nonsingles which became singles later */
    if (cf == cb) {
        return ref_singleton(s, c, adj, edg, cf);
    }

    /* Establish connected list */
    memcpy(s->junk, c->lab + cf, size * sizeof(int));
    for (i = 0; i < size; ++i) {
        k = s->junk[i];
        for (j = adj[k]; j != adj[k+1]; ++j) {
            data_count(s, c, edg[j]);
        }
    }

    /* Refine the cells we're connected to */
    ret = refine_cell(s, c, ref_nonsingle_cell);

    /* Clear the counts; use lab because junk was overwritten */
    for (i = cf; i <= cb; ++i) {
        k = c->lab[i];
        for (j = adj[k]; j != adj[k+1]; ++j) {
            s->ccount[edg[j]] = 0;
        }
    }

    return ret;
}